

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void For_ManFileExperiment(void)

{
  int *piVar1;
  undefined1 auVar2 [16];
  int iVar3;
  void *__ptr;
  FILE *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  timespec ts;
  timespec local_30;
  
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  lVar7 = 0;
  printf("2^%d machine words (%d bytes).\n",0x19,0x8000000);
  iVar3 = 0x8000000;
  __ptr = malloc(0x8000000);
  auVar2 = _DAT_0094a040;
  iVar8 = 0;
  iVar9 = 1;
  iVar10 = 2;
  iVar11 = 3;
  do {
    piVar1 = (int *)((long)__ptr + lVar7 * 4);
    *piVar1 = iVar8;
    piVar1[1] = iVar9;
    piVar1[2] = iVar10;
    piVar1[3] = iVar11;
    lVar7 = lVar7 + 4;
    iVar8 = iVar8 + auVar2._0_4_;
    iVar9 = iVar9 + auVar2._4_4_;
    iVar10 = iVar10 + auVar2._8_4_;
    iVar11 = iVar11 + auVar2._12_4_;
  } while (lVar7 != 0x2000000);
  Abc_Print(iVar3,"%s =","Fillup");
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pFVar4 = fopen("test.txt","rb");
  lVar7 = 1;
  fread(__ptr,1,0x8000000,pFVar4);
  fclose(pFVar4);
  Abc_Print((int)pFVar4,"%s =","Read  ");
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  iVar3 = clock_gettime(3,&local_30);
  if (-1 < iVar3) {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar7 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pFVar4 = fopen("test.txt","wb");
  fwrite(__ptr,1,0x8000000,pFVar4);
  fclose(pFVar4);
  Abc_Print((int)pFVar4,"%s =","Write ");
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar5 + lVar7) / 1000000.0);
  return;
}

Assistant:

void For_ManFileExperiment()
{
    FILE * pFile;
    int * pBuffer;
    int i, Size, Exp = 25;
    abctime clk = Abc_Clock();
    int RetValue;

    Size = (1 << Exp);
    printf( "2^%d machine words (%d bytes).\n", Exp, (int)sizeof(int) * Size );

    pBuffer = ABC_ALLOC( int, Size );
    for ( i = 0; i < Size; i++ )
        pBuffer[i] = i;
ABC_PRT( "Fillup", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "rb" );
    RetValue = fread( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Read  ", Abc_Clock() - clk );

clk = Abc_Clock();
    pFile = fopen( "test.txt", "wb" );
    fwrite( pBuffer, 1, sizeof(int) * Size, pFile );
    fclose( pFile );
ABC_PRT( "Write ", Abc_Clock() - clk );
/*
2^25 machine words (134217728 bytes).
Fillup =    0.06 sec
Read   =    0.08 sec
Write  =    1.81 sec
*/
}